

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_svg.hpp
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
perior::to_svg<char,std::char_traits<char>,perior::point<double,2ul>>
          (basic_ostream<char,_std::char_traits<char>_> *os,
          rectangle<perior::point<double,_2UL>_> *box,
          cubic_periodic_boundary<perior::point<double,_2UL>_> *b,string *stroke,size_t stroke_width
          ,string *fill)

{
  double dVar1;
  bool bVar2;
  const_reference pdVar3;
  reference pdVar4;
  double dVar5;
  reference pvVar6;
  pointer ppVar7;
  pointer this;
  ostream *poVar8;
  undefined1 local_4f0 [8];
  point<double,_2UL> rg;
  point<double,_2UL> *xy;
  __normal_iterator<const_std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_*,_std::vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>_>
  local_4d0;
  const_iterator e;
  __normal_iterator<const_std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_*,_std::vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>_>
  local_4c0;
  const_iterator i_6;
  pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_> splitted;
  pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_> bx;
  size_t i_5;
  size_t sz;
  size_t dim;
  ulong local_440;
  size_t i_4;
  undefined1 local_428 [8];
  point<double,_2UL> upper;
  undefined1 local_408 [8];
  point<double,_2UL> lower;
  undefined1 local_3e8 [8];
  vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
  boxes;
  string *fill_local;
  size_t stroke_width_local;
  string *stroke_local;
  cubic_periodic_boundary<perior::point<double,_2UL>_> *b_local;
  rectangle<perior::point<double,_2UL>_> *box_local;
  basic_ostream<char,_std::char_traits<char>_> *os_local;
  ulong local_300;
  size_t i_2;
  point<double,_2UL> *retval_1;
  ulong local_2c0;
  size_t i_7;
  point<double,_2UL> *retval_2;
  ulong local_280;
  size_t i;
  point<double,_2UL> *retval;
  ulong local_240;
  size_t i_3;
  ulong local_1e0;
  size_t i_1;
  
  boxes.
  super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)fill;
  std::
  vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
  ::vector((vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
            *)local_3e8);
  std::
  vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
  ::reserve((vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
             *)local_3e8,4);
  point<double,_2UL>::point((point<double,_2UL> *)(upper.values_.elems + 1));
  for (local_280 = 0; local_280 < 2; local_280 = local_280 + 1) {
    pdVar3 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)box,local_280);
    dVar5 = *pdVar3;
    pdVar3 = boost::array<double,_2UL>::operator[](&(box->radius).values_,local_280);
    dVar1 = *pdVar3;
    pdVar4 = boost::array<double,_2UL>::operator[]
                       ((array<double,_2UL> *)(upper.values_.elems + 1),local_280);
    *pdVar4 = dVar5 - dVar1;
  }
  for (local_1e0 = 0; local_1e0 < 2; local_1e0 = local_1e0 + 1) {
    pdVar4 = boost::array<double,_2UL>::operator[]
                       ((array<double,_2UL> *)(upper.values_.elems + 1),local_1e0);
    dVar5 = *pdVar4;
    pdVar3 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)b,local_1e0);
    if (*pdVar3 <= dVar5) {
      pdVar4 = boost::array<double,_2UL>::operator[]
                         ((array<double,_2UL> *)(upper.values_.elems + 1),local_1e0);
      dVar5 = *pdVar4;
      pdVar3 = boost::array<double,_2UL>::operator[](&(b->upper_).values_,local_1e0);
      if (*pdVar3 <= dVar5) {
        pdVar3 = boost::array<double,_2UL>::operator[](&(b->width_).values_,local_1e0);
        dVar5 = *pdVar3;
        pdVar4 = boost::array<double,_2UL>::operator[]
                           ((array<double,_2UL> *)(upper.values_.elems + 1),local_1e0);
        *pdVar4 = *pdVar4 - dVar5;
      }
    }
    else {
      pdVar3 = boost::array<double,_2UL>::operator[](&(b->width_).values_,local_1e0);
      dVar5 = *pdVar3;
      pdVar4 = boost::array<double,_2UL>::operator[]
                         ((array<double,_2UL> *)(upper.values_.elems + 1),local_1e0);
      *pdVar4 = dVar5 + *pdVar4;
    }
  }
  point<double,_2UL>::point
            ((point<double,_2UL> *)local_408,(point<double,_2UL> *)(upper.values_.elems + 1));
  point<double,_2UL>::point((point<double,_2UL> *)&i_4);
  for (local_300 = 0; local_300 < 2; local_300 = local_300 + 1) {
    pdVar3 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)box,local_300);
    dVar5 = *pdVar3;
    pdVar3 = boost::array<double,_2UL>::operator[](&(box->radius).values_,local_300);
    dVar1 = *pdVar3;
    pdVar4 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)&i_4,local_300);
    *pdVar4 = dVar5 + dVar1;
  }
  for (local_240 = 0; local_240 < 2; local_240 = local_240 + 1) {
    pdVar4 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)&i_4,local_240);
    dVar5 = *pdVar4;
    pdVar3 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)b,local_240);
    if (*pdVar3 <= dVar5) {
      pdVar4 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)&i_4,local_240);
      dVar5 = *pdVar4;
      pdVar3 = boost::array<double,_2UL>::operator[](&(b->upper_).values_,local_240);
      if (*pdVar3 <= dVar5) {
        pdVar3 = boost::array<double,_2UL>::operator[](&(b->width_).values_,local_240);
        dVar5 = *pdVar3;
        pdVar4 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)&i_4,local_240);
        *pdVar4 = *pdVar4 - dVar5;
      }
    }
    else {
      pdVar3 = boost::array<double,_2UL>::operator[](&(b->width_).values_,local_240);
      dVar5 = *pdVar3;
      pdVar4 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)&i_4,local_240);
      *pdVar4 = dVar5 + *pdVar4;
    }
  }
  point<double,_2UL>::point((point<double,_2UL> *)local_428,(point<double,_2UL> *)&i_4);
  for (local_440 = 0; local_440 < 2; local_440 = local_440 + 1) {
    pdVar3 = boost::array<double,_2UL>::operator[](&(box->radius).values_,local_440);
    dVar5 = *pdVar3;
    pdVar3 = boost::array<double,_2UL>::operator[](&(b->half_width_).values_,local_440);
    if (*pdVar3 <= dVar5) {
      pdVar3 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)b,local_440);
      dVar5 = *pdVar3;
      pdVar4 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)local_408,local_440);
      *pdVar4 = dVar5;
      pdVar3 = boost::array<double,_2UL>::operator[](&(b->upper_).values_,local_440);
      dVar5 = *pdVar3;
      pdVar4 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)local_428,local_440);
      *pdVar4 = dVar5;
    }
  }
  std::make_pair<perior::point<double,2ul>&,perior::point<double,2ul>&>
            ((pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_> *)&dim,
             (point<double,_2UL> *)local_408,(point<double,_2UL> *)local_428);
  std::
  vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
  ::push_back((vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
               *)local_3e8,(value_type *)&dim);
  for (sz = 0; sz < 2; sz = sz + 1) {
    dVar5 = (double)std::
                    vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                    ::size((vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                            *)local_3e8);
    for (bx.second.values_.elems[1] = 0.0; (ulong)bx.second.values_.elems[1] < (ulong)dVar5;
        bx.second.values_.elems[1] = (double)((long)bx.second.values_.elems[1] + 1)) {
      pvVar6 = std::
               vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
               ::at((vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                     *)local_3e8,(size_type)bx.second.values_.elems[1]);
      std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>::pair
                ((pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_> *)
                 (splitted.second.values_.elems + 1),pvVar6);
      pdVar4 = boost::array<double,_2UL>::operator[]
                         ((array<double,_2UL> *)(splitted.second.values_.elems + 1),sz);
      dVar1 = *pdVar4;
      pdVar4 = boost::array<double,_2UL>::operator[]
                         ((array<double,_2UL> *)(bx.first.values_.elems + 1),sz);
      if (*pdVar4 <= dVar1 && dVar1 != *pdVar4) {
        std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>::pair
                  ((pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_> *)&i_6,
                   (pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_> *)
                   (splitted.second.values_.elems + 1));
        pdVar3 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)b,sz);
        dVar1 = *pdVar3;
        pdVar4 = boost::array<double,_2UL>::operator[]
                           ((array<double,_2UL> *)(splitted.second.values_.elems + 1),sz);
        *pdVar4 = dVar1;
        pdVar3 = boost::array<double,_2UL>::operator[](&(b->upper_).values_,sz);
        dVar1 = *pdVar3;
        pdVar4 = boost::array<double,_2UL>::operator[]
                           ((array<double,_2UL> *)(splitted.first.values_.elems + 1),sz);
        *pdVar4 = dVar1;
        pvVar6 = std::
                 vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                 ::at((vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                       *)local_3e8,(size_type)bx.second.values_.elems[1]);
        std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>::operator=
                  (pvVar6,(type)(splitted.second.values_.elems + 1));
        std::
        vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
        ::push_back((vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                     *)local_3e8,(value_type *)&i_6);
      }
    }
  }
  e._M_current = (pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_> *)
                 std::
                 vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                 ::begin((vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                          *)local_3e8);
  __gnu_cxx::
  __normal_iterator<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>const*,std::vector<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>,std::allocator<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>>>>
  ::__normal_iterator<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>*>
            ((__normal_iterator<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>const*,std::vector<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>,std::allocator<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>>>>
              *)&local_4c0,
             (__normal_iterator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_*,_std::vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>_>
              *)&e);
  xy = (point<double,_2UL> *)
       std::
       vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
       ::end((vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
              *)local_3e8);
  __gnu_cxx::
  __normal_iterator<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>const*,std::vector<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>,std::allocator<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>>>>
  ::__normal_iterator<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>*>
            ((__normal_iterator<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>const*,std::vector<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>,std::allocator<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>>>>
              *)&local_4d0,
             (__normal_iterator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_*,_std::vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>_>
              *)&xy);
  while (bVar2 = __gnu_cxx::operator!=(&local_4c0,&local_4d0), bVar2) {
    rg.values_.elems[1] =
         (double)__gnu_cxx::
                 __normal_iterator<const_std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_*,_std::vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>_>
                 ::operator->(&local_4c0);
    ppVar7 = __gnu_cxx::
             __normal_iterator<const_std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_*,_std::vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>_>
             ::operator->(&local_4c0);
    this = __gnu_cxx::
           __normal_iterator<const_std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_*,_std::vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>_>
           ::operator->(&local_4c0);
    point<double,_2UL>::point((point<double,_2UL> *)local_4f0);
    for (local_2c0 = 0; local_2c0 < 2; local_2c0 = local_2c0 + 1) {
      pdVar3 = boost::array<double,_2UL>::operator[](&(ppVar7->second).values_,local_2c0);
      dVar5 = *pdVar3;
      pdVar3 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)this,local_2c0);
      dVar1 = *pdVar3;
      pdVar4 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)local_4f0,local_2c0);
      *pdVar4 = dVar5 - dVar1;
    }
    poVar8 = std::operator<<(os,"<rect x = \"");
    pdVar3 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)rg.values_.elems[1],0);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,*pdVar3);
    poVar8 = std::operator<<(poVar8,"\" y = \"");
    pdVar3 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)rg.values_.elems[1],1);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,*pdVar3);
    poVar8 = std::operator<<(poVar8,"\" width = \"");
    pdVar3 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)local_4f0,0);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,*pdVar3);
    poVar8 = std::operator<<(poVar8,"\" height = \"");
    pdVar3 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)local_4f0,1);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,*pdVar3);
    poVar8 = std::operator<<(poVar8,"\" stroke = \"");
    poVar8 = std::operator<<(poVar8,(string *)stroke);
    poVar8 = std::operator<<(poVar8,"\" stroke-width = \"");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,stroke_width);
    poVar8 = std::operator<<(poVar8,"\" fill = \"");
    poVar8 = std::operator<<(poVar8,(string *)
                                    boxes.
                                    super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator<<(poVar8,"\"/>\n");
    __gnu_cxx::
    __normal_iterator<const_std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_*,_std::vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>_>
    ::operator++(&local_4c0);
  }
  std::
  vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
  ::~vector((vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
             *)local_3e8);
  return os;
}

Assistant:

std::basic_ostream<charT, traits>&
to_svg(std::basic_ostream<charT, traits>&     os,
       const rectangle<pointT>&               box,
       const cubic_periodic_boundary<pointT>& b,
       const std::string&                     stroke       = "black",
       const std::size_t                      stroke_width = 1,
       const std::string&                     fill         = "none")
{
    BOOST_STATIC_ASSERT_MSG(
            ::perior::traits::dimension<pointT>::value == 2,
            "to_svg works only with 2-dimensional rectangle");

    // split box according to the boundary
    // here, use box
    std::vector<std::pair<pointT, pointT> > boxes; boxes.reserve(4);
    pointT lower = restrict_position(box.center - box.radius, b);
    pointT upper = restrict_position(box.center + box.radius, b);
    for(std::size_t i=0; i<2; ++i)
    {
        if(box.radius[i] >= b.half_width()[i])
        {
            lower[i] = b.lower()[i];
            upper[i] = b.upper()[i];
        }
    }

    boxes.push_back(std::make_pair(lower, upper));

    for(std::size_t dim=0; dim < 2; ++dim)
    {
        const std::size_t sz = boxes.size();
        for(std::size_t i=0; i<sz; ++i)
        {
            std::pair<pointT, pointT> bx = boxes.at(i);
            if(bx.first[dim] > bx.second[dim])
            {
                std::pair<pointT, pointT> splitted(bx);
                bx.first[dim]        = b.lower()[dim];
                splitted.second[dim] = b.upper()[dim];
                boxes.at(i) = bx;
                boxes.push_back(splitted);
            }
        }
    }

    for(typename std::vector<std::pair<pointT, pointT> >::const_iterator
            i(boxes.begin()), e(boxes.end()); i != e; ++i)
    {
        const pointT& xy = i->first;
        const pointT  rg = i->second - i->first;
        os << "<rect x = \""   << xy[0]  << "\" y = \""      << xy[1]
           << "\" width = \""  << rg[0]  << "\" height = \"" << rg[1]
           << "\" stroke = \"" << stroke << "\" stroke-width = \"" << stroke_width
           << "\" fill = \""   << fill   << "\"/>\n";
    }
    return os;
}